

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O2

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::StringLiteral>
          (SampledValueFuncVisitor *this,StringLiteral *expr)

{
  SourceLocation SVar1;
  bool bVar2;
  KnownSystemName KVar3;
  SyntaxNode *pSVar4;
  Diagnostic *this_00;
  string_view arg;
  
  bVar2 = ClockInference::isSampledValueFuncCall(&expr->super_Expression);
  if (bVar2) {
    KVar3 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
    SVar1 = expr[1].super_Expression.sourceRange.startLoc;
    if (KVar3 == Past) {
      if (SVar1 != (SourceLocation)0x4) goto LAB_00335268;
      pSVar4 = *(SyntaxNode **)&expr[1].super_Expression.syntax[1].super_SyntaxNode;
    }
    else {
      if (SVar1 != (SourceLocation)0x2) goto LAB_00335268;
      pSVar4 = ((expr[1].super_Expression.syntax)->super_SyntaxNode).parent;
    }
    if (pSVar4->kind == AssertionItemPort) {
LAB_00335268:
      this_00 = AnalysisContext::addDiag
                          (this->context,this->parentSymbol,(DiagCode)0x8000e,
                           (expr->super_Expression).sourceRange);
      arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
      Diagnostic::operator<<(this_00,arg);
      return;
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }